

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

int main(void)

{
  test_value_ctor();
  test_assignment();
  test_string_traits();
  test_custom_storage();
  test_bool_storage();
  test_representation_value();
  test_mark_fp_nan();
  test_mark_value_init();
  test_mark_stl_empty();
  test_mark_enum();
  test_true_or_novalue();
  test_order_by_representation();
  test_order_by_value();
  test_mark_dual_storage_1();
  test_mark_dual_storage_2();
  test_dual_storage_ordering();
  test_default_markable();
  test_dual_storage_with_tuple_default_and_move_ctor();
  test_dual_storage_with_tuple_copy_ctor();
  test_dual_storage_with_tuple_init_state_mutation();
  most_hostile_types::test();
  nested_markable::test();
  test_manual_cmp();
  return 0;
}

Assistant:

int main()
{
  test_value_ctor();
  test_assignment();
  test_string_traits();
  test_custom_storage();
  test_bool_storage();
  test_representation_value();
  test_mark_fp_nan();
  test_mark_value_init();
  test_mark_stl_empty();
  test_mark_enum();
  test_true_or_novalue();
  test_order_by_representation();
  test_order_by_value();

#if defined AK_TOOLKIT_USING_BOOST
  test_optional_as_storage();
#endif

  test_mark_dual_storage_1();
  test_mark_dual_storage_2();
  test_dual_storage_ordering();
  test_default_markable();
  test_dual_storage_with_tuple_default_and_move_ctor();
  test_dual_storage_with_tuple_copy_ctor();
  test_dual_storage_with_tuple_init_state_mutation();
  most_hostile_types::test();
  nested_markable::test();
  test_manual_cmp();
}